

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

Entity __thiscall entityx::EntityManager::create_from_copy(EntityManager *this,Entity original)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  Entity EVar5;
  
  EVar5 = create(this);
  uVar2 = entityx::Entity::component_mask();
  lVar3 = *(long *)(this + 0x30);
  if (*(long *)(this + 0x38) != lVar3) {
    uVar4 = 0;
    do {
      plVar1 = *(long **)(lVar3 + uVar4 * 8);
      if (plVar1 != (long *)0x0) {
        if (0x3f < uVar4) {
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::test",uVar4,0x40
                    );
        }
        if ((uVar2 >> (uVar4 & 0x3f) & 1) != 0) {
          (**(code **)(*plVar1 + 0x18))
                    (plVar1,original.manager_,original.id_.id_.id_,EVar5.manager_,EVar5.id_.id_.id_)
          ;
        }
      }
      uVar4 = uVar4 + 1;
      lVar3 = *(long *)(this + 0x30);
    } while (uVar4 < (ulong)(*(long *)(this + 0x38) - lVar3 >> 3));
  }
  return EVar5;
}

Assistant:

Entity create_from_copy(Entity original) {
    assert(original.valid());
    auto clone = create();
    auto mask = original.component_mask();
    for (size_t i = 0; i < component_helpers_.size(); i++) {
      BaseComponentHelper *helper = component_helpers_[i];
      if (helper && mask.test(i))
        helper->copy_component_to(original, clone);
    }
    return clone;
  }